

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  int local_14;
  int i;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    while (0 < ctxt->urlNr) {
      xmlXIncludeURLPop(ctxt);
    }
    if (ctxt->urlTab != (xmlChar **)0x0) {
      (*xmlFree)(ctxt->urlTab);
    }
    for (local_14 = 0; local_14 < ctxt->incNr; local_14 = local_14 + 1) {
      if (ctxt->incTab[local_14] != (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeFreeRef(ctxt->incTab[local_14]);
      }
    }
    if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
      (*xmlFree)(ctxt->incTab);
    }
    if (ctxt->txtTab != (xmlChar **)0x0) {
      for (local_14 = 0; local_14 < ctxt->txtNr; local_14 = local_14 + 1) {
        if (ctxt->txtTab[local_14] != (xmlChar *)0x0) {
          (*xmlFree)(ctxt->txtTab[local_14]);
        }
      }
      (*xmlFree)(ctxt->txtTab);
    }
    if (ctxt->txturlTab != (xmlURL *)0x0) {
      for (local_14 = 0; local_14 < ctxt->txtNr; local_14 = local_14 + 1) {
        if (ctxt->txturlTab[local_14] != (xmlURL)0x0) {
          (*xmlFree)(ctxt->txturlTab[local_14]);
        }
      }
      (*xmlFree)(ctxt->txturlTab);
    }
    if (ctxt->base != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->base);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "Freeing context\n");
#endif
    if (ctxt == NULL)
	return;
    while (ctxt->urlNr > 0)
	xmlXIncludeURLPop(ctxt);
    if (ctxt->urlTab != NULL)
	xmlFree(ctxt->urlTab);
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txtTab[i] != NULL)
		xmlFree(ctxt->txtTab[i]);
	}
	xmlFree(ctxt->txtTab);
    }
    if (ctxt->txturlTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txturlTab[i] != NULL)
		xmlFree(ctxt->txturlTab[i]);
	}
	xmlFree(ctxt->txturlTab);
    }
    if (ctxt->base != NULL) {
        xmlFree(ctxt->base);
    }
    xmlFree(ctxt);
}